

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O1

int __thiscall
pstore::brokerface::channel<std::condition_variable>::listen_abi_cxx11_
          (channel<std::condition_variable> *this,int __fd,int __n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Map_pointer ppbVar2;
  _Elt_pointer pbVar3;
  size_type sVar4;
  undefined4 in_register_00000014;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined4 in_register_00000034;
  string message;
  unique_lock<std::mutex> lock;
  size_type *local_50;
  size_type local_40;
  undefined8 uStack_38;
  unique_lock<std::mutex> local_30;
  
  this_00 = (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_register_00000014,__n);
  local_30._M_owns = false;
  local_30._M_device = (mutex_type *)CONCAT44(in_register_00000034,__fd);
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  if ((char)this_00[1].
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size == '\x01') {
    do {
      ppbVar2 = (this_00->
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Deque_impl_data._M_finish._M_node;
      pbVar3 = (this_00->
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (((long)(this_00->
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_start._M_last - (long)pbVar3 >> 5) +
          ((long)(this_00->
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)(this_00->
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
          ((((ulong)((long)ppbVar2 -
                    (long)(this_00->
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppbVar2 == (_Map_pointer)0x0)) * 0x10 != 0) {
        local_50 = (size_type *)(pbVar3->_M_dataplus)._M_p;
        paVar1 = &pbVar3->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50 == paVar1) {
          local_40 = paVar1->_M_allocated_capacity;
          uStack_38 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
          local_50 = &local_40;
        }
        else {
          local_40 = paVar1->_M_allocated_capacity;
        }
        sVar4 = pbVar3->_M_string_length;
        (pbVar3->_M_dataplus)._M_p = (pointer)paVar1;
        pbVar3->_M_string_length = 0;
        (pbVar3->field_2)._M_local_buf[0] = '\0';
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_front(this_00);
        (this->mut_).super___mutex_base._M_mutex.__size[0] = '\x01';
        *(undefined1 **)((long)&(this->mut_).super___mutex_base._M_mutex + 8) =
             (undefined1 *)((long)&(this->mut_).super___mutex_base._M_mutex + 0x18);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&(this->mut_).super___mutex_base._M_mutex + 8),local_50,
                   (pointer)(sVar4 + (long)local_50));
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        goto LAB_00117846;
      }
      std::condition_variable::wait
                ((unique_lock *)
                 ((mutex_type *)CONCAT44(in_register_00000034,__fd))[1].super___mutex_base._M_mutex.
                 __align);
    } while ((char)this_00[1].
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_map_size != '\0');
  }
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 8) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
LAB_00117846:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return (int)this;
}

Assistant:

maybe<std::string> channel<ConditionVariable>::listen (subscriber_type & sub) {
            std::unique_lock<std::mutex> lock{mut_};
            while (sub.active_) {
                if (sub.queue_.size () == 0) {
                    cv_->wait (lock);
                } else {
                    std::string const message = std::move (sub.queue_.front ());
                    sub.queue_.pop ();
                    return just (message);
                }
            }
            return nothing<std::string> ();
        }